

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHash.h
# Opt level: O0

bool __thiscall
HighsHashTable<MatrixRow,_int>::findPosition
          (HighsHashTable<MatrixRow,_int> *this,KeyType *key,u8 *meta,u64 *startPos,u64 *maxPos,
          u64 *pos)

{
  ulong uVar1;
  u8 uVar2;
  bool bVar3;
  u64 hash_00;
  u64 uVar4;
  pointer pHVar5;
  type puVar6;
  HighsHashTable<MatrixRow,_int> *pHVar7;
  ulong *in_RCX;
  u8 *in_RDX;
  HighsHashTable<MatrixRow,_int> *in_RDI;
  ulong *in_R8;
  ulong *in_R9;
  u64 currentDistance;
  Entry *entryArray;
  u64 hash;
  MatrixRow *in_stack_ffffffffffffff88;
  HighsHashTable<MatrixRow,_int> *in_stack_ffffffffffffff90;
  MatrixRow *in_stack_ffffffffffffffb0;
  
  hash_00 = HighsHashHelpers::hash<MatrixRow,_0>(in_stack_ffffffffffffffb0);
  *in_RCX = hash_00 >> ((byte)in_RDI->numHashShift & 0x3f);
  uVar1 = *in_RCX;
  uVar4 = maxDistance();
  *in_R8 = uVar1 + uVar4 & in_RDI->tableSizeMask;
  uVar2 = toMetadata(in_RDI,hash_00);
  *in_RDX = uVar2;
  pHVar5 = std::
           unique_ptr<HighsHashTableEntry<MatrixRow,_int>,_HighsHashTable<MatrixRow,_int>::OpNewDeleter>
           ::get(&in_stack_ffffffffffffff90->entries);
  *in_R9 = *in_RCX;
  while( true ) {
    puVar6 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::operator[]
                       ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                        in_stack_ffffffffffffff90,(size_t)in_stack_ffffffffffffff88);
    bVar3 = occupied(in_RDI,*puVar6);
    if (!bVar3) {
      return false;
    }
    puVar6 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::operator[]
                       ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                        in_stack_ffffffffffffff90,(size_t)in_stack_ffffffffffffff88);
    if (*puVar6 == *in_RDX) {
      HighsHashTableEntry<MatrixRow,_int>::key(pHVar5 + *in_R9);
      bVar3 = HighsHashHelpers::equal<MatrixRow,_0>
                        ((MatrixRow *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      if (bVar3) {
        return true;
      }
    }
    in_stack_ffffffffffffff90 =
         (HighsHashTable<MatrixRow,_int> *)(*in_R9 - *in_RCX & in_RDI->tableSizeMask);
    pHVar7 = (HighsHashTable<MatrixRow,_int> *)
             distanceFromIdealSlot(in_stack_ffffffffffffff90,(u64)in_stack_ffffffffffffff88);
    if (pHVar7 < in_stack_ffffffffffffff90) break;
    *in_R9 = *in_R9 + 1 & in_RDI->tableSizeMask;
    if (*in_R9 == *in_R8) {
      return false;
    }
  }
  return false;
}

Assistant:

bool findPosition(const KeyType& key, u8& meta, u64& startPos, u64& maxPos,
                    u64& pos) const {
    u64 hash = HighsHashHelpers::hash(key);
    startPos = hash >> numHashShift;
    maxPos = (startPos + maxDistance()) & tableSizeMask;
    meta = toMetadata(hash);

    const Entry* entryArray = entries.get();
    pos = startPos;
    do {
      if (!occupied(metadata[pos])) return false;
      if (metadata[pos] == meta &&
          HighsHashHelpers::equal(key, entryArray[pos].key()))
        return true;

      u64 currentDistance = (pos - startPos) & tableSizeMask;
      if (currentDistance > distanceFromIdealSlot(pos)) return false;

      pos = (pos + 1) & tableSizeMask;
    } while (pos != maxPos);

    return false;
  }